

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::HasError(WastParser *this)

{
  pointer pEVar1;
  long lVar2;
  long lVar3;
  pointer pEVar4;
  pointer pEVar5;
  
  pEVar5 = (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pEVar1 - (long)pEVar5;
  for (lVar2 = lVar3 / 0x48 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    pEVar4 = pEVar5;
    if (pEVar5->error_level == Error) goto LAB_0017d58d;
    if (pEVar5[1].error_level == Error) {
      pEVar4 = pEVar5 + 1;
      goto LAB_0017d58d;
    }
    if (pEVar5[2].error_level == Error) {
      pEVar4 = pEVar5 + 2;
      goto LAB_0017d58d;
    }
    if (pEVar5[3].error_level == Error) {
      pEVar4 = pEVar5 + 3;
      goto LAB_0017d58d;
    }
    pEVar5 = pEVar5 + 4;
    lVar3 = lVar3 + -0x120;
  }
  lVar3 = lVar3 / 0x48;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pEVar4 = pEVar1;
      if ((lVar3 != 3) || (pEVar4 = pEVar5, pEVar5->error_level == Error)) goto LAB_0017d58d;
      pEVar5 = pEVar5 + 1;
    }
    pEVar4 = pEVar5;
    if (pEVar5->error_level == Error) goto LAB_0017d58d;
    pEVar5 = pEVar5 + 1;
  }
  pEVar4 = pEVar5;
  if (pEVar5->error_level != Error) {
    pEVar4 = pEVar1;
  }
LAB_0017d58d:
  return pEVar4 != pEVar1;
}

Assistant:

bool WastParser::HasError() const {
  return std::any_of(errors_->begin(), errors_->end(), [](const auto& x) {
    return x.error_level == ErrorLevel::Error;
  });
}